

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O3

void __thiscall
NTrodeObj::serialize<cereal::PortableBinaryOutputArchive>
          (NTrodeObj *this,PortableBinaryOutputArchive *archive)

{
  PortableBinaryOutputArchive *pPVar1;
  PortableBinaryOutputArchive *pPVar2;
  pointer data;
  size_type local_30;
  
  pPVar1 = (archive->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self;
  pPVar2 = (((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
           super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self;
  local_30 = (this->id)._M_string_length;
  cereal::PortableBinaryOutputArchive::saveBinary<8ul>
            ((((((((((((pPVar2->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)
                     ->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
                   super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
                 super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,&local_30,8);
  cereal::PortableBinaryOutputArchive::saveBinary<1ul>
            ((((((pPVar2->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,
             (this->id)._M_dataplus._M_p,(this->id)._M_string_length);
  pPVar1 = (pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self;
  cereal::PortableBinaryOutputArchive::saveBinary<4ul>
            ((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,&this->index,4);
  pPVar1 = (((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
           super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self;
  local_30 = (long)(this->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2;
  cereal::PortableBinaryOutputArchive::saveBinary<8ul>
            ((((((((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)
                     ->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
                   super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
                 super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,&local_30,8);
  data = (this->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start;
  cereal::PortableBinaryOutputArchive::saveBinary<4ul>
            ((((((pPVar1->super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
               super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self)->
             super_OutputArchive<cereal::PortableBinaryOutputArchive,_1U>).self,data,
             (long)(this->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)data);
  return;
}

Assistant:

void serialize(Archive &archive){
        archive(id, index, hw_chans);
    }